

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Polynomial<double>::FindRealRoots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Polynomial<double> *this)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  void *pvVar3;
  _Base_ptr *pp_Var4;
  undefined1 auVar5 [16];
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  mapped_type_conflict *pmVar8;
  double *pdVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  iterator iVar12;
  _Rb_tree_color _Var13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint uVar17;
  double dVar18;
  double dVar19;
  _Base_ptr p_Var20;
  double dVar21;
  double dVar22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  double dVar25;
  double dVar26;
  DynamicVector<double,_std::allocator<double>_> imags;
  DynamicVector<double,_std::allocator<double>_> reals;
  Eigenvalue<double> eig;
  DynamicRectMatrix<double> companion;
  undefined8 local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_128;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_f8;
  double local_d8;
  ulong uStack_d0;
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  DynamicRectMatrix<double> local_90;
  DynamicRectMatrix<double> local_80;
  pointer local_70;
  pointer local_60;
  double local_48;
  undefined4 uStack_40;
  uint uStack_3c;
  DynamicRectMatrix<double> local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  _Var13 = _S_red;
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
switchD_002202b1_default:
    CreateCompanion((Polynomial<double> *)&local_30);
    JAMA::Eigenvalue<double>::Eigenvalue((Eigenvalue<double> *)local_c8,&local_30);
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              (&local_f8,(long)local_b8 - CONCAT44(local_c8._12_4_,local_c8._8_4_) >> 3);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_f8,(vector<double,_std::allocator<double>_> *)(local_c8 + 8));
    std::vector<double,_std::allocator<double>_>::operator=(&local_118,&local_a8);
    if (0 < (int)_Var13) {
      lVar14 = 0;
      do {
        if (ABS(*(double *)
                 ((long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar14)) < 1e-08) {
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar12,
                       (double *)
                       ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar14));
          }
          else {
            *iVar12._M_current =
                 *(double *)
                  ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
        }
        lVar14 = lVar14 + 8;
      } while ((ulong)_Var13 << 3 != lVar14);
    }
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70,(long)local_60 - (long)local_70);
    }
    DynamicRectMatrix<double>::deallocate(&local_80);
    DynamicRectMatrix<double>::deallocate(&local_90);
    if ((_Base_ptr)
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (_Base_ptr)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar3 = (void *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_b0 - (long)pvVar3);
    }
    DynamicRectMatrix<double>::deallocate(&local_30);
  }
  else {
    do {
      if ((int)_Var13 < (int)p_Var6[1]._M_color) {
        _Var13 = p_Var6[1]._M_color;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    switch(_Var13) {
    case _S_black:
      p_Var20 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var23 = &p_Var1->_M_header;
      p_Var24 = p_Var20;
      if (p_Var20 == (_Base_ptr)0x0) {
        uVar15 = 0;
        uVar16 = 0;
        p_Var20 = (_Base_ptr)0x0;
      }
      else {
        do {
          psVar2 = (size_t *)(p_Var24 + 1);
          if (0 < (int)*psVar2) {
            p_Var23 = p_Var24;
          }
          pp_Var4 = &p_Var24->_M_left;
          p_Var24 = pp_Var4[(int)*psVar2 < 1];
        } while (pp_Var4[(int)*psVar2 < 1] != (_Base_ptr)0x0);
        uVar15 = 0;
        uVar16 = 0;
        p_Var24 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var23 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var23)->_M_node_count < 2)) {
          uVar15 = (undefined4)*(undefined8 *)((long)p_Var23 + 0x28);
          uVar16 = (undefined4)((ulong)*(undefined8 *)((long)p_Var23 + 0x28) >> 0x20);
        }
        do {
          if (-1 < (int)p_Var20[1]._M_color) {
            p_Var24 = p_Var20;
          }
          p_Var20 = (&p_Var20->_M_left)[p_Var20[1]._M_color >> 0x1f];
        } while (p_Var20 != (_Base_ptr)0x0);
        p_Var20 = (_Base_ptr)0x0;
        if (((_Rb_tree_header *)p_Var24 != p_Var1) && ((int)p_Var24[1]._M_color < 1)) {
          p_Var20 = p_Var24[1]._M_parent;
        }
      }
      local_c8._0_8_ = -(double)p_Var20 / (double)CONCAT44(uVar16,uVar15);
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,(iterator)0x0,(double *)local_c8);
      return __return_storage_ptr__;
    case 2:
      p_Var20 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      dVar22 = -0.0;
      p_Var23 = &p_Var1->_M_header;
      p_Var24 = p_Var20;
      if (p_Var20 == (_Base_ptr)0x0) {
        p_Var23 = (_Base_ptr)0x0;
        dVar19 = 0.0;
      }
      else {
        do {
          psVar2 = (size_t *)(p_Var24 + 1);
          if (1 < (int)*psVar2) {
            p_Var23 = p_Var24;
          }
          pp_Var4 = &p_Var24->_M_left;
          p_Var24 = pp_Var4[(int)*psVar2 < 2];
        } while (pp_Var4[(int)*psVar2 < 2] != (_Base_ptr)0x0);
        dVar19 = 0.0;
        p_Var24 = &p_Var1->_M_header;
        p_Var7 = p_Var20;
        if (((_Rb_tree_header *)p_Var23 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var23)->_M_node_count < 3)) {
          dVar19 = *(double *)((long)p_Var23 + 0x28);
        }
        do {
          p_Var23 = p_Var7 + 1;
          if (0 < (int)p_Var23->_M_color) {
            p_Var24 = p_Var7;
          }
          pp_Var4 = &p_Var7->_M_left;
          p_Var7 = pp_Var4[(int)p_Var23->_M_color < 1];
        } while (pp_Var4[(int)p_Var23->_M_color < 1] != (_Base_ptr)0x0);
        p_Var23 = (_Base_ptr)0x0;
        p_Var7 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var24 != p_Var1) && ((int)p_Var24[1]._M_color < 2)) {
          p_Var23 = p_Var24[1]._M_parent;
        }
        do {
          if (-1 < (int)p_Var20[1]._M_color) {
            p_Var7 = p_Var20;
          }
          p_Var20 = (&p_Var20->_M_left)[p_Var20[1]._M_color >> 0x1f];
        } while (p_Var20 != (_Base_ptr)0x0);
        dVar22 = -0.0;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) && (dVar22 = -0.0, (int)p_Var7[1]._M_color < 1)) {
          dVar22 = (double)p_Var7[1]._M_parent * -4.0;
        }
      }
      dVar22 = (double)p_Var23 * (double)p_Var23 + dVar22 * dVar19;
      dVar22 = (double)(-(ulong)(1e-08 < ABS(dVar22)) & (ulong)dVar22);
      if (dVar22 < 0.0) {
        return __return_storage_ptr__;
      }
      dVar19 = 0.5 / dVar19;
      if (dVar22 <= 0.0) {
        local_c8._0_8_ = (double)p_Var23 * -dVar19;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,(iterator)0x0,(double *)local_c8);
        return __return_storage_ptr__;
      }
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      local_c8._0_8_ = (-(double)p_Var23 - dVar22) * dVar19;
      iVar12._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      if (iVar12._M_current == pdVar9) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar12,(double *)local_c8);
        iVar12._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar12._M_current = (double)local_c8._0_8_;
        iVar12._M_current = iVar12._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar12._M_current;
      }
      dVar19 = dVar19 * (dVar22 - (double)p_Var23);
      if (iVar12._M_current == pdVar9) {
        local_c8._0_8_ = dVar19;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar12,(double *)local_c8);
        return __return_storage_ptr__;
      }
      break;
    case 3:
      p_Var7 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var23 = (_Base_ptr)0x0;
      uVar15 = 0;
      uVar16 = 0;
      p_Var20 = (_Base_ptr)0x0;
      p_Var24 = (_Base_ptr)0x0;
      p_Var10 = &p_Var1->_M_header;
      p_Var11 = p_Var7;
      if (p_Var7 != (_Base_ptr)0x0) {
        do {
          psVar2 = (size_t *)(p_Var11 + 1);
          if (2 < (int)*psVar2) {
            p_Var10 = p_Var11;
          }
          pp_Var4 = &p_Var11->_M_left;
          p_Var11 = pp_Var4[(int)*psVar2 < 3];
        } while (pp_Var4[(int)*psVar2 < 3] != (_Base_ptr)0x0);
        uVar15 = 0;
        uVar16 = 0;
        p_Var23 = &p_Var1->_M_header;
        p_Var20 = p_Var7;
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var10)->_M_node_count < 4)) {
          uVar15 = (undefined4)*(undefined8 *)((long)p_Var10 + 0x28);
          uVar16 = (undefined4)((ulong)*(undefined8 *)((long)p_Var10 + 0x28) >> 0x20);
        }
        do {
          p_Var24 = p_Var20 + 1;
          if (1 < (int)p_Var24->_M_color) {
            p_Var23 = p_Var20;
          }
          pp_Var4 = &p_Var20->_M_left;
          p_Var20 = pp_Var4[(int)p_Var24->_M_color < 2];
        } while (pp_Var4[(int)p_Var24->_M_color < 2] != (_Base_ptr)0x0);
        p_Var20 = (_Base_ptr)0x0;
        p_Var24 = &p_Var1->_M_header;
        p_Var10 = p_Var7;
        if (((_Rb_tree_header *)p_Var23 != p_Var1) && ((int)p_Var23[1]._M_color < 3)) {
          p_Var20 = p_Var23[1]._M_parent;
        }
        do {
          p_Var23 = p_Var10 + 1;
          if (0 < (int)p_Var23->_M_color) {
            p_Var24 = p_Var10;
          }
          pp_Var4 = &p_Var10->_M_left;
          p_Var10 = pp_Var4[(int)p_Var23->_M_color < 1];
        } while (pp_Var4[(int)p_Var23->_M_color < 1] != (_Base_ptr)0x0);
        p_Var23 = (_Base_ptr)0x0;
        p_Var10 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var24 != p_Var1) && ((int)p_Var24[1]._M_color < 2)) {
          p_Var23 = p_Var24[1]._M_parent;
        }
        do {
          if (-1 < (int)p_Var7[1]._M_color) {
            p_Var10 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[p_Var7[1]._M_color >> 0x1f];
        } while (p_Var7 != (_Base_ptr)0x0);
        p_Var24 = (_Base_ptr)0x0;
        if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color < 1)) {
          p_Var24 = p_Var10[1]._M_parent;
        }
      }
      dVar19 = 1.0 / (double)CONCAT44(uVar16,uVar15);
      dVar22 = dVar19 * (double)p_Var20;
      dVar18 = dVar22 * 0.3333333333333333;
      dVar21 = (((dVar22 + dVar22) * dVar22 + (double)p_Var23 * dVar19 * -9.0) * dVar22 *
                0.037037037037037035 + (double)p_Var24 * dVar19) * 0.5;
      dVar19 = (double)p_Var23 * dVar19 - dVar22 * dVar18;
      dVar22 = dVar21 * dVar21 + dVar19 * dVar19 * dVar19 * 0.037037037037037035;
      dVar22 = (double)(-(ulong)(1e-08 < ABS(dVar22)) & (ulong)dVar22);
      if (dVar22 <= 0.0) {
        if (0.0 <= dVar22) {
          if (0.0 <= dVar21) {
            dVar19 = pow(dVar21,0.3333333333333333);
            uVar17 = (uint)((ulong)dVar19 >> 0x20) ^ 0x80000000;
            uVar15 = SUB84(dVar19,0);
          }
          else {
            dVar19 = pow(-dVar21,0.3333333333333333);
            uVar15 = SUB84(dVar19,0);
            uVar17 = (uint)((ulong)dVar19 >> 0x20);
          }
          local_158 = (double)CONCAT44(uVar17,uVar15);
          local_c8._0_8_ =
               ((double)CONCAT44(uVar17,uVar15) + (double)CONCAT44(uVar17,uVar15)) - dVar18;
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)local_c8);
            iVar12._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar12._M_current = (double)local_c8._0_8_;
            iVar12._M_current = iVar12._M_current + 1;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          dVar19 = -local_158 - dVar18;
          if (iVar12._M_current == pdVar9) {
            local_c8._0_8_ = dVar19;
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)local_c8);
            iVar12._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar12._M_current = dVar19;
            iVar12._M_current = iVar12._M_current + 1;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          if (iVar12._M_current == pdVar9) {
            local_c8._0_8_ = dVar19;
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)local_c8);
            return __return_storage_ptr__;
          }
        }
        else {
          dVar19 = dVar19 * -0.3333333333333333;
          if (dVar19 < 0.0) {
            dVar19 = sqrt(dVar19);
          }
          else {
            dVar19 = SQRT(dVar19);
          }
          if (-0.0 < dVar22) {
            dVar22 = sqrt(-dVar22);
          }
          else {
            dVar22 = SQRT(-dVar22);
          }
          dVar22 = atan2(dVar22,-dVar21);
          dVar21 = cos(dVar22 * 0.3333333333333333);
          dVar22 = sin(dVar22 * 0.3333333333333333);
          local_c8._0_8_ = (dVar19 + dVar19) * dVar21 - dVar18;
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)local_c8);
            iVar12._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar12._M_current = (double)local_c8._0_8_;
            iVar12._M_current = iVar12._M_current + 1;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_c8._0_8_ = -dVar18 - (dVar22 * 1.7320508075688772 + dVar21) * dVar19;
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)local_c8);
            iVar12._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar12._M_current = (double)local_c8._0_8_;
            iVar12._M_current = iVar12._M_current + 1;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          dVar19 = (dVar22 * -1.7320508075688772 + dVar21) * -dVar19 + -dVar18;
          if (iVar12._M_current == pdVar9) {
            local_c8._0_8_ = dVar19;
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)local_c8);
            return __return_storage_ptr__;
          }
        }
      }
      else {
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        dVar19 = dVar22 - dVar21;
        if (0.0 <= dVar19) {
          dVar19 = pow(dVar19,0.3333333333333333);
          uVar15 = SUB84(dVar19,0);
          uVar17 = (uint)((ulong)dVar19 >> 0x20);
        }
        else {
          dVar19 = pow(-dVar19,0.3333333333333333);
          uVar17 = (uint)((ulong)dVar19 >> 0x20) ^ 0x80000000;
          uVar15 = SUB84(dVar19,0);
        }
        local_128 = (_Base_ptr)CONCAT44(uVar17,uVar15);
        dVar22 = -dVar21 - dVar22;
        if (0.0 <= dVar22) {
          dVar19 = pow(dVar22,0.3333333333333333);
          dVar19 = dVar19 + (double)local_128;
        }
        else {
          dVar19 = pow(-dVar22,0.3333333333333333);
          dVar19 = (double)local_128 - dVar19;
        }
        dVar19 = dVar19 - dVar18;
        iVar12._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_c8._0_8_ = dVar19;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar12,
                     (double *)local_c8);
          return __return_storage_ptr__;
        }
      }
      break;
    case 4:
      p_Var20 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var23 = &p_Var1->_M_header;
      p_Var24 = p_Var20;
      if (p_Var20 == (_Base_ptr)0x0) {
        uVar15 = 0;
        uVar16 = 0;
        local_128 = (_Base_ptr)0x0;
        local_148 = ZEXT816(0);
        local_d8 = 0.0;
        local_138 = ZEXT816(0);
LAB_002208b1:
        local_158 = (double)CONCAT44(uVar16,uVar15);
      }
      else {
        do {
          p_Var7 = p_Var24 + 1;
          if (3 < (int)p_Var7->_M_color) {
            p_Var23 = p_Var24;
          }
          pp_Var4 = &p_Var24->_M_left;
          p_Var24 = pp_Var4[(int)p_Var7->_M_color < 4];
        } while (pp_Var4[(int)p_Var7->_M_color < 4] != (_Base_ptr)0x0);
        uVar15 = 0;
        uVar16 = 0;
        if (((_Rb_tree_header *)p_Var23 != p_Var1) && ((int)p_Var23[1]._M_color < 5)) {
          uVar15 = SUB84(p_Var23[1]._M_parent,0);
          uVar16 = (undefined4)((ulong)p_Var23[1]._M_parent >> 0x20);
        }
        local_d8 = (double)CONCAT44(uVar16,uVar15);
        p_Var24 = &p_Var1->_M_header;
        p_Var23 = p_Var20;
        do {
          if (2 < (int)*(size_t *)(p_Var23 + 1)) {
            p_Var24 = p_Var23;
          }
          p_Var23 = (&p_Var23->_M_left)[(int)*(size_t *)(p_Var23 + 1) < 3];
        } while (p_Var23 != (_Base_ptr)0x0);
        local_148 = ZEXT816(0);
        p_Var23 = &p_Var1->_M_header;
        p_Var7 = p_Var20;
        if (((_Rb_tree_header *)p_Var24 != p_Var1) &&
           ((int)((_Rb_tree_header *)p_Var24)->_M_node_count < 4)) {
          local_148._8_8_ = 0;
          local_148._0_8_ = *(ulong *)((long)p_Var24 + 0x28);
        }
        do {
          p_Var24 = p_Var7 + 1;
          if (1 < (int)p_Var24->_M_color) {
            p_Var23 = p_Var7;
          }
          pp_Var4 = &p_Var7->_M_left;
          p_Var7 = pp_Var4[(int)p_Var24->_M_color < 2];
        } while (pp_Var4[(int)p_Var24->_M_color < 2] != (_Base_ptr)0x0);
        local_138 = ZEXT816(0);
        p_Var24 = &p_Var1->_M_header;
        p_Var7 = p_Var20;
        if (((_Rb_tree_header *)p_Var23 != p_Var1) && ((int)p_Var23[1]._M_color < 3)) {
          local_138._8_8_ = 0;
          local_138._0_8_ = p_Var23[1]._M_parent;
        }
        do {
          p_Var23 = p_Var7 + 1;
          if (0 < (int)p_Var23->_M_color) {
            p_Var24 = p_Var7;
          }
          pp_Var4 = &p_Var7->_M_left;
          p_Var7 = pp_Var4[(int)p_Var23->_M_color < 1];
        } while (pp_Var4[(int)p_Var23->_M_color < 1] != (_Base_ptr)0x0);
        local_128 = (_Base_ptr)0x0;
        p_Var23 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var24 != p_Var1) && ((int)p_Var24[1]._M_color < 2)) {
          local_128 = p_Var24[1]._M_parent;
        }
        do {
          if (-1 < (int)p_Var20[1]._M_color) {
            p_Var23 = p_Var20;
          }
          p_Var20 = (&p_Var20->_M_left)[p_Var20[1]._M_color >> 0x1f];
        } while (p_Var20 != (_Base_ptr)0x0);
        local_158 = 0.0;
        if (((_Rb_tree_header *)p_Var23 != p_Var1) && ((int)p_Var23[1]._M_color < 1)) {
          uVar15 = SUB84(p_Var23[1]._M_parent,0);
          uVar16 = (undefined4)((ulong)p_Var23[1]._M_parent >> 0x20);
          goto LAB_002208b1;
        }
      }
      auVar5 = local_138;
      local_b0 = (_Base_ptr)(local_c8 + 8);
      local_c8._8_4_ = _S_red;
      local_b8 = (_Base_ptr)0x0;
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_f8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_b0;
      pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)local_c8,(key_type *)&local_f8);
      local_d8 = 1.0 / local_d8;
      local_158 = local_158 * local_d8;
      dVar25 = (double)local_128 * local_d8;
      dVar21 = (double)local_138._0_8_ * local_d8;
      dVar18 = (double)local_148._0_8_ * local_d8;
      uStack_d0 = local_148._8_8_ ^ 0x8000000000000000;
      local_d8 = -dVar18 * dVar18;
      *pmVar8 = (local_d8 * local_158 + dVar21 * 4.0 * local_158) - dVar25 * dVar25;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 1;
      pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)local_c8,(key_type *)&local_f8);
      *pmVar8 = dVar18 * dVar25 + local_158 * -4.0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 2;
      pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)local_c8,(key_type *)&local_f8);
      local_138._0_4_ = SUB84(dVar21,0);
      local_138._4_4_ = (undefined4)((ulong)dVar21 >> 0x20);
      uStack_3c = auVar5._12_4_ ^ 0x80000000;
      uStack_40 = auVar5._8_4_;
      local_48 = -dVar21;
      *(undefined4 *)pmVar8 = local_138._0_4_;
      *(uint *)((long)pmVar8 + 4) = local_138._4_4_ ^ 0x80000000;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,3);
      pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)local_c8,(key_type *)&local_f8);
      *pmVar8 = 1.0;
      FindRealRoots(&local_f8,(Polynomial<double> *)local_c8);
      dVar19 = *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar22 = dVar18 * 0.25 * dVar18 + local_48 + dVar19;
      dVar22 = (double)(-(ulong)(1e-08 < ABS(dVar22)) & (ulong)dVar22);
      if (dVar22 <= 0.0) {
        if ((dVar22 < 0.0) || (dVar19 = dVar19 * dVar19 + local_158 * -4.0, dVar19 < -1e-08))
        goto LAB_002213d2;
        dVar22 = 0.0;
        if (0.0 <= dVar19) {
          dVar22 = dVar19;
        }
        dVar25 = SQRT(dVar22) + SQRT(dVar22);
        dVar22 = dVar18 * 0.75 * dVar18 - (dVar21 + dVar21);
        dVar19 = dVar22 + dVar25;
        if (1e-08 <= dVar19) {
          if (dVar19 < 0.0) {
            dVar19 = sqrt(dVar19);
          }
          else {
            dVar19 = SQRT(dVar19);
          }
          local_d8 = dVar18 * -0.25;
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(local_d8 + dVar19 * 0.5);
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)&local_118);
            iVar12._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar12._M_current =
                 (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            iVar12._M_current = iVar12._M_current + 1;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(local_d8 - dVar19 * 0.5);
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)&local_118);
          }
          else {
            *iVar12._M_current =
                 (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
        }
        dVar22 = dVar22 - dVar25;
        if (dVar22 < 1e-08) goto LAB_002213d2;
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(dVar18 * -0.25 + dVar22 * 0.5);
        iVar12._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar12._M_current == pdVar9) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar12,(double *)&local_118);
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar12._M_current =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          iVar12._M_current = iVar12._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current;
        }
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(dVar18 * -0.25 - dVar22 * 0.5);
        if (iVar12._M_current == pdVar9) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar12,(double *)&local_118);
          goto LAB_002213d2;
        }
      }
      else {
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        dVar26 = (dVar18 * 0.75 * dVar18 - dVar22 * dVar22) - (dVar21 + dVar21);
        local_d8 = (local_d8 * dVar18 + dVar18 * 4.0 * dVar21 + dVar25 * -8.0) / (dVar22 * 4.0);
        dVar19 = local_d8 + dVar26;
        dVar19 = (double)(-(ulong)(1e-08 < ABS(dVar19)) & (ulong)dVar19);
        if (0.0 <= dVar19) {
          if (dVar19 < 0.0) {
            dVar19 = sqrt(dVar19);
          }
          else {
            dVar19 = SQRT(dVar19);
          }
          local_48 = dVar18 * -0.25;
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((dVar22 + dVar19) * 0.5 + local_48);
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)&local_118);
            iVar12._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar12._M_current =
                 (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            iVar12._M_current = iVar12._M_current + 1;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current;
          }
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(local_48 + (dVar22 - dVar19) * 0.5);
          if (iVar12._M_current == pdVar9) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,iVar12,(double *)&local_118);
          }
          else {
            *iVar12._M_current =
                 (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
        }
        dVar26 = dVar26 - local_d8;
        dVar26 = (double)(-(ulong)(1e-08 < ABS(dVar26)) & (ulong)dVar26);
        if (dVar26 < 0.0) goto LAB_002213d2;
        if (dVar26 < 0.0) {
          dVar26 = sqrt(dVar26);
        }
        else {
          dVar26 = SQRT(dVar26);
        }
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)((dVar26 - dVar22) * 0.5 + dVar18 * -0.25);
        iVar12._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar12._M_current == pdVar9) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar12,(double *)&local_118);
          iVar12._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar12._M_current =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          iVar12._M_current = iVar12._M_current + 1;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current;
        }
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(dVar18 * -0.25 + (dVar22 + dVar26) * -0.5);
        if (iVar12._M_current == pdVar9) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar12,(double *)&local_118);
          goto LAB_002213d2;
        }
      }
      *iVar12._M_current =
           (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar12._M_current + 1;
LAB_002213d2:
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)local_c8);
      return __return_storage_ptr__;
    default:
      goto switchD_002202b1_default;
    }
    *iVar12._M_current = dVar19;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar12._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Real> FindRealRoots() {
      const Real fEpsilon = 1.0e-8;
      std::vector<Real> roots;
      roots.clear();

      const int deg = degree();

      switch (deg) {
      case 1: {
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);
        roots.push_back(-fC0 / fC1);
        return roots;
      }
      case 2: {
        Real fC2    = getCoefficient(2);
        Real fC1    = getCoefficient(1);
        Real fC0    = getCoefficient(0);
        Real fDiscr = fC1 * fC1 - 4.0 * fC0 * fC2;
        if (abs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr < (Real)0.0) {  // complex roots only
          return roots;
        }

        Real fTmp = ((Real)0.5) / fC2;

        if (fDiscr > (Real)0.0) {  // 2 real roots
          fDiscr = sqrt(fDiscr);
          roots.push_back(fTmp * (-fC1 - fDiscr));
          roots.push_back(fTmp * (-fC1 + fDiscr));
        } else {
          roots.push_back(-fTmp * fC1);  // 1 real root
        }
      }
        return roots;
      case 3: {
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^3+c2*x^2+c1*x+c0
        Real fInvC3 = ((Real)1.0) / fC3;
        fC0 *= fInvC3;
        fC1 *= fInvC3;
        fC2 *= fInvC3;

        // convert to y^3+a*y+b = 0 by x = y-c2/3
        const Real fThird         = (Real)1.0 / (Real)3.0;
        const Real fTwentySeventh = (Real)1.0 / (Real)27.0;
        Real fOffset              = fThird * fC2;
        Real fA                   = fC1 - fC2 * fOffset;
        Real fB = fC0 + fC2 * (((Real)2.0) * fC2 * fC2 - ((Real)9.0) * fC1) *
                            fTwentySeventh;
        Real fHalfB = ((Real)0.5) * fB;

        Real fDiscr = fHalfB * fHalfB + fA * fA * fA * fTwentySeventh;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {  // 1 real, 2 complex roots

          fDiscr     = sqrt(fDiscr);
          Real fTemp = -fHalfB + fDiscr;
          Real root;
          if (fTemp >= (Real)0.0) {
            root = pow(fTemp, fThird);
          } else {
            root = -pow(-fTemp, fThird);
          }
          fTemp = -fHalfB - fDiscr;
          if (fTemp >= (Real)0.0) {
            root += pow(fTemp, fThird);
          } else {
            root -= pow(-fTemp, fThird);
          }
          root -= fOffset;

          roots.push_back(root);
        } else if (fDiscr < (Real)0.0) {
          const Real fSqrt3 = sqrt((Real)3.0);
          Real fDist        = sqrt(-fThird * fA);
          Real fAngle       = fThird * atan2(sqrt(-fDiscr), -fHalfB);
          Real fCos         = cos(fAngle);
          Real fSin         = sin(fAngle);
          roots.push_back(((Real)2.0) * fDist * fCos - fOffset);
          roots.push_back(-fDist * (fCos + fSqrt3 * fSin) - fOffset);
          roots.push_back(-fDist * (fCos - fSqrt3 * fSin) - fOffset);
        } else {
          Real fTemp;
          if (fHalfB >= (Real)0.0) {
            fTemp = -pow(fHalfB, fThird);
          } else {
            fTemp = pow(-fHalfB, fThird);
          }
          roots.push_back(((Real)2.0) * fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
        }
      }
        return roots;
      case 4: {
        Real fC4 = getCoefficient(4);
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^4+c3*x^3+c2*x^2+c1*x+c0
        Real fInvC4 = ((Real)1.0) / fC4;
        fC0 *= fInvC4;
        fC1 *= fInvC4;
        fC2 *= fInvC4;
        fC3 *= fInvC4;

        // reduction to resolvent cubic polynomial y^3+r2*y^2+r1*y+r0 = 0
        Real fR0 = -fC3 * fC3 * fC0 + ((Real)4.0) * fC2 * fC0 - fC1 * fC1;
        Real fR1 = fC3 * fC1 - ((Real)4.0) * fC0;
        Real fR2 = -fC2;
        Polynomial<Real> tempCubic;
        tempCubic.setCoefficient(0, fR0);
        tempCubic.setCoefficient(1, fR1);
        tempCubic.setCoefficient(2, fR2);
        tempCubic.setCoefficient(3, 1.0);
        std::vector<Real> cubeRoots = tempCubic.FindRealRoots();  // always
        // produces
        // at
        // least
        // one
        // root
        Real fY = cubeRoots[0];

        Real fDiscr = ((Real)0.25) * fC3 * fC3 - fC2 + fY;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {
          Real fR  = sqrt(fDiscr);
          Real fT1 = ((Real)0.75) * fC3 * fC3 - fR * fR - ((Real)2.0) * fC2;
          Real fT2 =
              (((Real)4.0) * fC3 * fC2 - ((Real)8.0) * fC1 - fC3 * fC3 * fC3) /
              (((Real)4.0) * fR);

          Real fTplus  = fT1 + fT2;
          Real fTminus = fT1 - fT2;
          if (fabs(fTplus) <= fEpsilon) { fTplus = (Real)0.0; }
          if (fabs(fTminus) <= fEpsilon) { fTminus = (Real)0.0; }

          if (fTplus >= (Real)0.0) {
            Real fD = sqrt(fTplus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR + fD));
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR - fD));
          }
          if (fTminus >= (Real)0.0) {
            Real fE = sqrt(fTminus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fE - fR));
            roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * (fE + fR));
          }
        } else if (fDiscr < (Real)0.0) {
          // roots.clear();
        } else {
          Real fT2 = fY * fY - ((Real)4.0) * fC0;
          if (fT2 >= -fEpsilon) {
            if (fT2 < (Real)0.0) {  // round to zero
              fT2 = (Real)0.0;
            }
            fT2      = ((Real)2.0) * sqrt(fT2);
            Real fT1 = ((Real)0.75) * fC3 * fC3 - ((Real)2.0) * fC2;
            if (fT1 + fT2 >= fEpsilon) {
              Real fD = sqrt(fT1 + fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fD);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fD);
            }
            if (fT1 - fT2 >= fEpsilon) {
              Real fE = sqrt(fT1 - fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fE);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fE);
            }
          }
        }
      }
        return roots;
      default: {
        DynamicRectMatrix<Real> companion = CreateCompanion();
        JAMA::Eigenvalue<Real> eig(companion);
        DynamicVector<Real> reals, imags;
        eig.getRealEigenvalues(reals);
        eig.getImagEigenvalues(imags);

        for (int i = 0; i < deg; i++) {
          if (fabs(imags(i)) < fEpsilon) roots.push_back(reals(i));
        }
      }
        return roots;
      }
    }